

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference.hpp
# Opt level: O0

iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>_>
* __thiscall
burst::difference<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&>
          (iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>_>
           *__return_storage_ptr__,burst *this,vector<int,_std::allocator<int>_> *minuend,
          vector<int,_std::allocator<int>_> *subtrahend)

{
  difference_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
  Begin;
  difference_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
  End;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_68 [8];
  difference_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
  end;
  difference_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
  begin;
  vector<int,_std::allocator<int>_> *subtrahend_local;
  vector<int,_std::allocator<int>_> *minuend_local;
  
  make_difference_iterator<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            ((difference_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
              *)&end.field_0x20,this,minuend,subtrahend);
  make_difference_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<void>>
            (local_68,(burst *)&end.field_0x20);
  memcpy(local_98,&end.field_0x20,0x28);
  memcpy(&local_c0,local_68,0x28);
  Begin.m_minuend_end._M_current = (int *)local_88;
  Begin.m_minuend_begin._M_current = (int *)uStack_90;
  Begin.m_subtrahend_begin._M_current = (int *)uStack_80;
  Begin.m_subtrahend_end._M_current = (int *)local_78;
  Begin._32_8_ = local_c0;
  End.m_minuend_end._M_current = (int *)local_b0;
  End.m_minuend_begin._M_current = (int *)uStack_b8;
  End.m_subtrahend_begin._M_current = (int *)uStack_a8;
  End.m_subtrahend_end._M_current = (int *)local_a0;
  End._32_8_ = in_stack_ffffffffffffff28;
  boost::
  make_iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<void>>>
            (Begin,End);
  return __return_storage_ptr__;
}

Assistant:

auto difference (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        auto begin =
            make_difference_iterator
            (
                std::forward<ForwardRange1>(minuend),
                std::forward<ForwardRange2>(subtrahend)
            );
        auto end = make_difference_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }